

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListMessage.cpp
# Opt level: O3

void __thiscall ListMessage::ListMessage(ListMessage *this,char *directory)

{
  ServerOperation::ServerOperation(&this->super_ServerOperation,directory);
  (this->super_ServerOperation)._vptr_ServerOperation = (_func_int **)&PTR_fillMe_00109d58;
  (this->User)._M_dataplus._M_p = (pointer)&(this->User).field_2;
  (this->User)._M_string_length = 0;
  (this->User).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_ServerOperation).statusMessage,0,
             (char *)(this->super_ServerOperation).statusMessage._M_string_length,0x1071c7);
  return;
}

Assistant:

ListMessage::ListMessage(const char * directory) :ServerOperation(directory) {
    statusMessage = "User:";
}